

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

RequiredError * CLI::RequiredError::Subcommand(size_t min_subcom)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator<char> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  ExitCodes in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  RequiredError *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31;
  
  if (in_RSI == 1) {
    pbVar1 = &local_31;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
    RequiredError((RequiredError *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ::std::__cxx11::string::~string(pbVar1);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    pbVar1 = in_RDI;
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff78);
    ::std::operator+((char *)pbVar1,in_stack_ffffffffffffff40);
    ::std::operator+(pbVar1,(char *)in_stack_ffffffffffffff40);
    RequiredError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    ::std::__cxx11::string::~string(in_stack_ffffffffffffff40);
    ::std::__cxx11::string::~string(in_stack_ffffffffffffff40);
    ::std::__cxx11::string::~string(in_stack_ffffffffffffff40);
  }
  return (RequiredError *)in_RDI;
}

Assistant:

static RequiredError Subcommand(std::size_t min_subcom) {
        if(min_subcom == 1) {
            return RequiredError("A subcommand");
        }
        return {"Requires at least " + std::to_string(min_subcom) + " subcommands", ExitCodes::RequiredError};
    }